

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

X * __thiscall IMLE::predictStrongest(IMLE *this,Z *z)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  predictMultiple(this,z);
  if ((long)this->nSolFound < 1) {
    iVar2 = 0;
  }
  else {
    dVar5 = 0.0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      dVar1 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if (dVar5 < dVar1) {
        uVar3 = uVar4 & 0xffffffff;
      }
      iVar2 = (int)uVar3;
      if (dVar1 <= dVar5) {
        dVar1 = dVar5;
      }
      dVar5 = dVar1;
      uVar4 = uVar4 + 1;
    } while ((long)this->nSolFound != uVar4);
  }
  this->solIdx = iVar2;
  return (this->predictions).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start + iVar2;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predictStrongest(Z const &z)
{
    predictMultiple(z);

    Scal w = 0.0;
    int best = 0;
    for(int i=0; i < nSolFound; i++)
        if( predictionsWeight[i] > w )
        {
            w = predictionsWeight[i];
            best = i;
        }

    solIdx = best;

    //          Not needed, already in predict()
    // hasPredJacobian = false;
    // hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}